

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.h
# Opt level: O3

void __thiscall Net::Train(Net *this)

{
  Matrix<float,_35,_1,_0,_35,_1> *pMVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  PointerType ptr;
  ulong uVar40;
  size_t i;
  Matrix<float,_35,_1,_0,_35,_1> *pMVar41;
  float *pfVar42;
  Matrix<float,_64,_1,_0,_64,_1> *pMVar43;
  float *pfVar44;
  long lVar45;
  long lVar46;
  Matrix<float,_64,_35,_0,_64,_35> *pMVar47;
  size_t j;
  Matrix<float,_72,_64,_0,_72,_64> *pMVar48;
  Matrix<float,_64,_35,_0,_64,_35> *pMVar49;
  Matrix<float,_72,_64,_0,_72,_64> *pMVar50;
  float fVar51;
  float fVar52;
  MatrixXf cur;
  DenseStorage<float,__1,__1,__1,_0> local_108;
  float local_e4;
  Matrix<float,_64,_1,_0,_64,_1> *local_e0;
  XprType local_d8;
  XprType local_a8;
  XprType *local_78;
  block_evaluator<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true> local_60;
  block_evaluator<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true> local_50;
  XprType *local_40;
  XprType *local_38;
  
  local_108.m_data = (float *)0x0;
  local_108.m_rows = 0;
  local_108.m_cols = 0;
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_108,0x48,0xc,6);
  if ((local_108.m_rows != 0xc) || (local_108.m_cols != 6)) {
    Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_108,0x48,0xc,6);
    if ((local_108.m_rows != 0xc) || (local_108.m_cols != 6)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2d1,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, -1>, SrcXprType = Eigen::Matrix<float, 12, 6>, T1 = float, T2 = float]"
                   );
    }
  }
  uVar40 = 0xfffffffffffffffc;
  do {
    pfVar42 = (this->pool2).super_PlainObjectBase<Eigen::Matrix<float,_12,_6,_0,_12,_6>_>.m_storage.
              m_data.array + uVar40 + 4;
    uVar3 = *(undefined8 *)(pfVar42 + 2);
    *(undefined8 *)(local_108.m_data + uVar40 + 4) = *(undefined8 *)pfVar42;
    *(undefined8 *)(local_108.m_data + uVar40 + 4 + 2) = uVar3;
    uVar40 = uVar40 + 4;
  } while (uVar40 < 0x44);
  Eigen::DenseStorage<float,_-1,_-1,_-1,_0>::resize(&local_108,0x48,0x48,1);
  pMVar50 = &this->v;
  local_e0 = &this->b;
  lVar46 = 0;
  pMVar48 = pMVar50;
  do {
    if (local_108.m_rows < 0 && local_108.m_data != (float *)0x0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, Level = 0]"
                   );
    }
    if (local_108.m_cols < 1) {
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<float, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    if (local_108.m_rows != 0x48) {
      __assert_fail("size() == other.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Dot.h"
                    ,0x52,
                    "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float, 72, 64>, 72, 1, true>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Block<Eigen::Matrix<float, 72, 64>, 72, 1, true>, OtherDerived = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                   );
    }
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_outerStride
         = 0x48;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>.m_data =
         local_108.m_data;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>._8_8_ = 0x48;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>._32_8_ = 0;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.m_outerStride =
         0;
    local_78 = (XprType *)0x48;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_0>.m_data =
         (PointerType)pMVar48;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_xpr =
         (XprTypeNested)pMVar50;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startCol.
    m_value = lVar46;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.m_startRow.
    m_value = (long)&local_108;
    Eigen::internal::block_evaluator<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_72,_1,_true,_true>::
    block_evaluator((block_evaluator<Eigen::Matrix<float,_72,_64,_0,_72,_64>,_72,_1,_true,_true> *)
                    &local_60,(XprType *)&local_d8);
    local_50.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
    .m_data = local_a8.
              super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>.
              m_data;
    local_40 = local_78;
    local_38 = &local_d8;
    dVar7 = exp(-((double)(local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x47] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x47] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x43] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x43] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x3f] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x3f] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x3b] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x3b] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x37] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x37] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x33] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x33] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x2f] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x2f] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x2b] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x2b] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x27] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x27] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x23] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x23] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x1f] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x1f] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x1b] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x1b] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x17] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x17] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x13] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x13] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0xf] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0xf] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0xb] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0xb] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[7] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[7] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[3] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[3] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x45] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x45] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x41] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x41] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x3d] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x3d] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x39] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x39] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x35] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x35] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x31] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x31] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x2d] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x2d] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x29] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x29] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x25] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x25] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x21] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x21] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x1d] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x1d] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x19] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x19] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x15] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x15] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0x11] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0x11] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[0xd] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[0xd] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[9] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[9] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[5] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[5] +
                           local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data[1] *
                           local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data[1] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x46] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x46] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x42] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x42] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x3e] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x3e] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x3a] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x3a] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x36] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x36] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x32] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x32] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x2e] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x2e] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x2a] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x2a] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x26] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x26] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x22] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x22] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x1e] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x1e] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x1a] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x1a] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x16] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x16] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x12] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x12] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0xe] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0xe] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[10] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[10] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[6] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[6] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[2] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[2] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x44] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x44] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x40] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x40] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x3c] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x3c] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x38] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x38] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x34] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x34] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x30] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x30] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x2c] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x2c] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x28] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x28] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x24] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x24] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x20] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x20] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x1c] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x1c] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x18] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x18] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x14] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x14] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0x10] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0x10] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[0xc] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[0xc] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[8] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[8] +
                          local_a8.
                          super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                          .m_data[4] *
                          local_60.
                          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                          .m_data[4] +
                          *local_a8.
                           super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>
                           .m_data *
                          *local_60.
                           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                           .m_data) -
                 (double)(this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.
                         m_storage.m_data.array[lVar46]));
    (this->b).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
    [lVar46] = (float)(1.0 / (dVar7 + 1.0));
    lVar46 = lVar46 + 1;
    pMVar48 = (Matrix<float,_72,_64,_0,_72,_64> *)
              ((pMVar48->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.
               m_data.array + 0x48);
  } while (lVar46 != 0x40);
  pMVar47 = &this->w;
  lVar46 = 0;
  pMVar49 = pMVar47;
  do {
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_outerStride
         = 0x40;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_0>.m_data =
         (PointerType)local_e0;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.m_xpr = local_e0
    ;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.m_startRow.
    m_value = 0;
    local_a8.super_BlockImpl<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>.m_outerStride =
         0x40;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_0>.m_data =
         (PointerType)pMVar49;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_xpr =
         pMVar47;
    local_d8.super_BlockImpl<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>.m_startCol.
    m_value = lVar46;
    Eigen::internal::block_evaluator<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true,_true>::
    block_evaluator(&local_60,&local_d8);
    Eigen::internal::block_evaluator<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true,_true>::
    block_evaluator(&local_50,&local_a8);
    local_40 = &local_d8;
    dVar7 = exp((double)(local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3f] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3f] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3b] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3b] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x37] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x37] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x33] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x33] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2f] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2f] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2b] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2b] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x27] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x27] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x23] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x23] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1f] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1f] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1b] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1b] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x17] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x17] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x13] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x13] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xf] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xf] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xb] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xb] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[7] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[7] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[3] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[3] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3d] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x3d] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x39] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x39] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x35] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x35] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x31] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x31] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2d] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x2d] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x29] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x29] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x25] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x25] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x21] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x21] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1d] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x1d] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x19] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x19] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x15] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x15] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x11] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0x11] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xd] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[0xd] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[9] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[9] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[5] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[5] +
                         local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[1] *
                         local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data[1] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3e] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3e] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3a] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3a] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x36] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x36] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x32] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x32] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2e] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2e] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2a] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2a] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x26] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x26] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x22] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x22] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1e] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1e] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1a] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1a] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x16] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x16] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x12] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x12] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xe] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xe] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[10] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[10] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[6] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[6] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[2] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[2] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3c] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x3c] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x38] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x38] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x34] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x34] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x30] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x30] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2c] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x2c] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x28] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x28] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x24] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x24] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x20] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x20] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1c] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x1c] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x18] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x18] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x14] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x14] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x10] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0x10] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xc] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[0xc] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[8] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[8] +
                        local_60.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[4] *
                        local_50.
                        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                        .m_data[4] +
                        *local_60.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_35,_0,_64,_35>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data *
                        *local_50.
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_64,_1,_0,_64,_1>,_64,_1,_true>,_Eigen::Matrix<float,_64,_1,_0,_64,_1>_>
                         .m_data) -
                (double)(this->o).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.
                        m_storage.m_data.array[lVar46]);
    (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar46] = (float)dVar7;
    lVar46 = lVar46 + 1;
    pMVar49 = (Matrix<float,_64,_35,_0,_64,_35> *)
              ((pMVar49->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
               m_data.array + 0x40);
  } while (lVar46 != 0x23);
  fVar8 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[0];
  fVar9 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[1];
  fVar10 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[2];
  fVar11 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[3];
  fVar12 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[4];
  fVar13 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[5];
  fVar14 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[6];
  fVar15 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[7];
  fVar16 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[8];
  fVar17 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[9];
  fVar18 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[10];
  fVar19 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xb];
  fVar20 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xc];
  fVar21 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xd];
  fVar22 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xe];
  fVar23 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0xf];
  fVar24 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x10];
  fVar25 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x11];
  fVar26 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x12];
  fVar27 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x13];
  fVar28 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x14];
  fVar29 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x15];
  fVar30 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x16];
  fVar31 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x17];
  fVar32 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x18];
  fVar33 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x19];
  fVar34 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1a];
  fVar35 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1b];
  fVar36 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1c];
  fVar37 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1d];
  fVar38 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1e];
  fVar39 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x1f];
  fVar51 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x21];
  fVar52 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data
           .array[0x22];
  fVar2 = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
          array[0x20];
  lVar46 = 0;
  do {
    (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.array
    [lVar46] = (this->yc).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.
               m_data.array[lVar46] /
               (fVar51 + fVar52 + fVar2 +
               fVar39 + fVar35 + fVar31 + fVar27 + fVar23 + fVar19 + fVar15 + fVar11 +
               fVar37 + fVar33 + fVar29 + fVar25 + fVar21 + fVar17 + fVar13 + fVar9 +
               fVar38 + fVar34 + fVar30 + fVar26 + fVar22 + fVar18 + fVar14 + fVar10 +
               fVar36 + fVar32 + fVar28 + fVar24 + fVar20 + fVar16 + fVar12 + fVar8);
    lVar46 = lVar46 + 1;
  } while (lVar46 != 0x23);
  this->ek = 0.0;
  pMVar1 = &this->g;
  lVar46 = -0x8c;
  do {
    local_e4 = *(float *)((long)(this->yc).
                                super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.
                                m_storage.m_data.array + lVar46);
    fVar51 = *(float *)((long)&this->ek + lVar46);
    *(float *)((long)(this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.
                     m_storage.m_data.array + lVar46 + -8) = fVar51 - local_e4;
    fVar51 = logf(fVar51);
    this->ek = this->ek - (double)(fVar51 * local_e4);
    lVar46 = lVar46 + 4;
  } while (lVar46 != 0);
  fVar51 = (this->g).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.m_data.
           array[0];
  pfVar42 = (this->w).super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>.m_storage.
            m_data.array + 0x40;
  lVar46 = 0;
  do {
    fVar52 = (pMVar47->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
             m_data.array[lVar46] * fVar51;
    lVar45 = 0;
    pfVar44 = (this->g).super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>.m_storage.
              m_data.array;
    do {
      pfVar44 = (float *)((long)pfVar44 + 4);
      fVar52 = fVar52 + pfVar42[lVar45] * *pfVar44;
      lVar45 = lVar45 + 0x40;
    } while (lVar45 != 0x880);
    fVar2 = (local_e0->super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>).m_storage.
            m_data.array[lVar46];
    (this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.m_data.array
    [lVar46] = fVar52 * (1.0 - fVar2) * fVar2;
    lVar46 = lVar46 + 1;
    pfVar42 = pfVar42 + 1;
  } while (lVar46 != 0x40);
  lVar46 = 0;
  do {
    lVar45 = 0;
    pMVar43 = &this->e;
    do {
      (pMVar50->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.m_data.
      array[lVar45] =
           (pMVar43->super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>).m_storage.m_data
           .array[0] * -0.3 *
           (this->x).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.m_data.
           array[lVar46] +
           (pMVar50->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.
           m_data.array[lVar45];
      lVar45 = lVar45 + 0x48;
      pMVar43 = (Matrix<float,_64,_1,_0,_64,_1> *)
                ((pMVar43->super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>).m_storage.
                 m_data.array + 1);
    } while (lVar45 != 0x1200);
    lVar46 = lVar46 + 1;
    pMVar50 = (Matrix<float,_72,_64,_0,_72,_64> *)
              ((pMVar50->super_PlainObjectBase<Eigen::Matrix<float,_72,_64,_0,_72,_64>_>).m_storage.
               m_data.array + 1);
  } while (lVar46 != 0x48);
  lVar46 = 0;
  do {
    fVar51 = (local_e0->super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>).m_storage.
             m_data.array[lVar46];
    lVar45 = 0;
    pMVar41 = pMVar1;
    do {
      (pMVar47->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.m_data.
      array[lVar45] =
           (pMVar41->super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).m_storage.m_data
           .array[0] * -0.4 * fVar51 +
           (pMVar47->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
           m_data.array[lVar45];
      lVar45 = lVar45 + 0x40;
      pMVar41 = (Matrix<float,_35,_1,_0,_35,_1> *)
                ((pMVar41->super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).m_storage.
                 m_data.array + 1);
    } while (lVar45 != 0x8c0);
    lVar46 = lVar46 + 1;
    pMVar47 = (Matrix<float,_64,_35,_0,_64,_35> *)
              ((pMVar47->super_PlainObjectBase<Eigen::Matrix<float,_64,_35,_0,_64,_35>_>).m_storage.
               m_data.array + 1);
  } while (lVar46 != 0x40);
  lVar46 = 0;
  do {
    uVar3 = *(undefined8 *)
             ((this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.
              m_data.array + lVar46 + 2);
    uVar4 = *(undefined8 *)
             ((this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.m_storage.
              m_data.array + lVar46);
    uVar5 = *(undefined8 *)
             ((this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.
              m_data.array + lVar46 + 2);
    uVar6 = *(undefined8 *)
             ((this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.
              m_data.array + lVar46);
    pfVar42 = (this->r).super_PlainObjectBase<Eigen::Matrix<float,_72,_1,_0,_72,_1>_>.m_storage.
              m_data.array + lVar46;
    *pfVar42 = (float)uVar4 * -0.3 + (float)uVar6;
    pfVar42[1] = (float)((ulong)uVar4 >> 0x20) * -0.3 + (float)((ulong)uVar6 >> 0x20);
    pfVar42[2] = (float)uVar3 * -0.3 + (float)uVar5;
    pfVar42[3] = (float)((ulong)uVar3 >> 0x20) * -0.3 + (float)((ulong)uVar5 >> 0x20);
    lVar46 = lVar46 + 4;
  } while (lVar46 != 0x40);
  lVar46 = -0x8c;
  do {
    *(float *)((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).
                     m_storage.m_data.array + lVar46) =
         *(float *)((long)(this->e).super_PlainObjectBase<Eigen::Matrix<float,_64,_1,_0,_64,_1>_>.
                          m_storage.m_data.array + lVar46 + -8) * -0.4 +
         *(float *)((long)(pMVar1->super_PlainObjectBase<Eigen::Matrix<float,_35,_1,_0,_35,_1>_>).
                          m_storage.m_data.array + lVar46);
    lVar46 = lVar46 + 4;
  } while (lVar46 != 0);
  free(local_108.m_data);
  return;
}

Assistant:

void Net::Train()
{
    //pool2.normalize();// use sigmod for hidden layer
    MatrixXf cur = pool2;
    cur.resize(D,1);

    /* Compute b[h], hidden layer output */
    for (size_t h = 0; h < Q; h++) {
        double alpha_h = v.col(h).dot(cur.col(0));
//        double alpha_h = 0;
//        for (size_t i = 0; i < D; i++)
//            alpha_h += v(i,h) * cur(i,0);
        b(h,0) = ACTIVE(alpha_h - r(h,0));
    }

    /* Compute yc[j] ,output layer output */
    for (size_t j = 0; j < L; j++) {
        double beta_j = 0;
        beta_j = w.col(j).dot(b.col(0));
//        for (size_t h = 0; h < Q; h++)
//            beta_j += w[h][j] * b[h];
        yc(j,0) = exp(beta_j - o(j,0));
    }
    /*softmax activation*/
    float SUM = yc.sum();
    for (size_t j = 0; j < L; j++)
    {
        yc(j,0) = yc(j,0)/SUM;
    }

    ek = 0;

    /* Compute g[j] and E ,g[i] is the output layer point loss, Ek is the output layer loss*/
    for (size_t j = 0; j < L; j++) {
        g[j] =  (yc[j] - y[j]);// update b for output layer, when update the b, plus g
        ek -= y[j]*log(yc[j]); //
    }

    /* Compute e[h] , e[h] is the hidden layer loss*/
    for (size_t h = 0; h < Q; h++) {
        double temp = 0;
        temp = w.row(h).dot(g);
        e[h] = b[h] * (1 - b[h]) * temp;
    }

    /* Update v[i][h], w[h][j], r[h], o[j] */
    for (size_t i = 0; i < D; i++)
        for (size_t h = 0; h < Q; h++)
            v(i,h) -= LEARN_RATE1 * e[h] * x[i];
    for (size_t h = 0; h < Q; h++)
        for (size_t j = 0; j < L; j++)
            w(h,j) -= LEARN_RATE2 * g[j] * b[h];

    for (size_t h = 0; h < Q; h++)
        r[h] -= ((LEARN_RATE1) * e[h]);

    for (size_t j = 0; j < L; j++)
        o[j] -= ((LEARN_RATE2) * g[j]);
}